

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v8::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> fmt,
               basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> args,
               locale_ref loc)

{
  char *last;
  appender out;
  undefined1 value [16];
  undefined1 value_00 [16];
  bool bVar1;
  type tVar2;
  char *lhs;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  aVar4;
  float value_01;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  aVar5;
  char *end;
  undefined8 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  char *local_80;
  undefined1 local_78 [28];
  uint uStack_5c;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_58;
  char *local_50;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  local_48;
  locale_ref local_40;
  writer write;
  
  aVar5 = args.field_1;
  pcVar3 = (char *)args.desc_;
  aVar4 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
           )fmt.size_;
  lhs = fmt.data_;
  if ((aVar4.values_ == (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)0x2) &&
     (bVar1 = equal2(lhs,"{}"), bVar1)) {
    if ((long)pcVar3 < 0) {
      if (((int)(type)args.desc_ < 1) || (tVar2 = (aVar5.args_)->type_, tVar2 == none_type))
      goto LAB_0011723c;
    }
    else {
      tVar2 = (type)args.desc_ & custom_type;
      if (((undefined1  [16])args & (undefined1  [16])0xf) == (undefined1  [16])0x0) {
LAB_0011723c:
        throw_format_error("argument not found");
      }
    }
    out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
         *(back_insert_iterator<fmt::v8::detail::buffer<char>_> *)&(aVar5.values_)->field_0;
    value_01 = out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_;
    local_78._0_8_ = buf;
    local_78._8_8_ = pcVar3;
    local_78._16_8_ = aVar5;
    unique0x1000069c = loc.locale_;
    switch(tVar2) {
    case int_type:
      write<char,_fmt::v8::appender,_int,_0>((appender)buf,(int)value_01);
      break;
    case uint_type:
      write<char,_fmt::v8::appender,_unsigned_int,_0>((appender)buf,(uint)value_01);
      break;
    case long_long_type:
      write<char,_fmt::v8::appender,_long_long,_0>
                ((appender)buf,
                 (longlong)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
      ;
      break;
    case ulong_long_type:
      write<char,_fmt::v8::appender,_unsigned_long_long,_0>
                ((appender)buf,
                 (unsigned_long_long)
                 out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      break;
    case int128_type:
      value._8_2_ = in_stack_ffffffffffffff70;
      value._0_8_ = in_stack_ffffffffffffff68;
      value._10_6_ = in_stack_ffffffffffffff72;
      write<char,_fmt::v8::appender,___int128,_0>((detail *)buf,out,(__int128)value);
      break;
    case uint128_type:
      value_00._8_2_ = in_stack_ffffffffffffff70;
      value_00._0_8_ = in_stack_ffffffffffffff68;
      value_00._10_6_ = in_stack_ffffffffffffff72;
      write<char,_fmt::v8::appender,_unsigned___int128,_0>
                ((detail *)buf,out,(unsigned___int128)value_00);
      break;
    case bool_type:
      default_arg_formatter<char>::operator()
                ((default_arg_formatter<char> *)local_78,
                 (bool)((byte)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container & 1));
      break;
    case char_type:
      write<char,fmt::v8::appender>
                ((appender)buf,
                 (byte)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      break;
    case float_type:
      write<char,_fmt::v8::appender,_float,_0>((appender)buf,value_01);
      break;
    case double_type:
      write<char,_fmt::v8::appender,_double,_0>
                ((appender)buf,
                 (double)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      break;
    case last_numeric_type:
      write<char,_fmt::v8::appender,_long_double,_0>
                ((appender)buf,((aVar5.values_)->field_0).long_double_value);
      break;
    case cstring_type:
      write<char,fmt::v8::appender>
                ((appender)buf,
                 (char *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      break;
    case string_type:
      copy_str_noinline<char,char_const*,fmt::v8::appender>
                ((char *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                 (char *)(((aVar5.values_)->field_0).custom.format +
                         (long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                               container),(appender)buf);
      break;
    case pointer_type:
      default_arg_formatter<char>::operator()
                ((default_arg_formatter<char> *)local_78,
                 (void *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
      break;
    case custom_type:
      default_arg_formatter<char>::operator()
                ((default_arg_formatter<char> *)local_78,(handle)((aVar5.values_)->field_0).string);
      break;
    default:
      default_arg_formatter<char>::operator()((default_arg_formatter<char> *)local_78);
    }
  }
  else {
    stack0xffffffffffffffa0 = (void *)((ulong)uStack_5c << 0x20);
    last = lhs + (long)aVar4.values_;
    end = lhs;
    local_40.locale_ = loc.locale_;
    local_48 = aVar5;
    local_50 = pcVar3;
    local_58.container = buf;
    local_78._16_8_ = aVar4;
    local_78._8_8_ = lhs;
    if ((long)aVar4.values_ < 0x20) {
      while (pcVar3 = end, pcVar3 != last) {
        end = pcVar3 + 1;
        if (*pcVar3 == '}') {
          if ((end == last) || (*end != '}')) {
            throw_format_error("unmatched \'}\' in format string");
          }
          vformat_to<char>::format_handler::on_text((format_handler *)local_78,lhs,end);
          lhs = pcVar3 + 2;
          end = lhs;
        }
        else if (*pcVar3 == '{') {
          vformat_to<char>::format_handler::on_text((format_handler *)local_78,lhs,pcVar3);
          lhs = parse_replacement_field<char,fmt::v8::detail::vformat_to<char>(fmt::v8::detail::buffer<char>&,fmt::v8::basic_string_view<char>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char>::type>>>::type,fmt::v8::type_identity<char>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                          (pcVar3,last,(format_handler *)local_78);
          end = lhs;
        }
      }
      vformat_to<char>::format_handler::on_text((format_handler *)local_78,lhs,last);
    }
    else {
      write.handler_ = (format_handler *)local_78;
      while (lhs != last) {
        local_80 = lhs;
        if ((*lhs != '{') &&
           (bVar1 = find<false,char,char_const*>(lhs + 1,last,'{',&local_80), !bVar1)) {
          parse_format_string<false,_char,_format_handler>::writer::operator()(&write,lhs,last);
          return;
        }
        parse_format_string<false,_char,_format_handler>::writer::operator()(&write,lhs,local_80);
        lhs = parse_replacement_field<char,fmt::v8::detail::vformat_to<char>(fmt::v8::detail::buffer<char>&,fmt::v8::basic_string_view<char>,fmt::v8::basic_format_args<fmt::v8::basic_format_context<std::conditional<std::is_same<fmt::v8::type_identity<char>::type,char>::value,fmt::v8::appender,std::back_insert_iterator<fmt::v8::detail::buffer<fmt::v8::type_identity<char>::type>>>::type,fmt::v8::type_identity<char>::type>>,fmt::v8::detail::locale_ref)::format_handler&>
                        (local_80,last,(format_handler *)local_78);
      }
    }
  }
  return;
}

Assistant:

void vformat_to(
    buffer<Char>& buf, basic_string_view<Char> fmt,
    basic_format_args<FMT_BUFFER_CONTEXT(type_identity_t<Char>)> args,
    locale_ref loc) {
  // workaround for msvc bug regarding name-lookup in module
  // link names into function scope
  using detail::arg_formatter;
  using detail::buffer_appender;
  using detail::custom_formatter;
  using detail::default_arg_formatter;
  using detail::get_arg;
  using detail::locale_ref;
  using detail::parse_format_specs;
  using detail::specs_checker;
  using detail::specs_handler;
  using detail::to_unsigned;
  using detail::type;
  using detail::write;
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> args, locale_ref loc)
        : parse_context(str), context(out, args, loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) on_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      if (arg.type() == type::custom_type) {
        parse_context.advance_to(parse_context.begin() +
                                 (begin - &*parse_context.begin()));
        visit_format_arg(custom_formatter<Char>{parse_context, context}, arg);
        return parse_context.begin();
      }
      auto specs = basic_format_specs<Char>();
      specs_checker<specs_handler<Char>> handler(
          specs_handler<Char>(specs, parse_context, context), arg.type());
      begin = parse_format_specs(begin, end, handler);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}